

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

double find_double(var *element,string *name,string *desired_units,string *default_units,
                  double default_value)

{
  double value;
  pointer pcVar1;
  int iVar2;
  var *pvVar3;
  string units;
  double local_88;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  pvVar3 = find(name,element);
  iVar2 = std::__cxx11::string::compare((char *)&pvVar3->units);
  if (iVar2 != 0) {
    default_units = &pvVar3->units;
  }
  pcVar1 = (default_units->_M_dataplus)._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + default_units->_M_string_length);
  value = pvVar3->value;
  if ((value != 0.0) || (local_88 = default_value, NAN(value))) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_80,local_80 + local_78);
    pcVar1 = (desired_units->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + desired_units->_M_string_length);
    local_88 = convert_units(value,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return local_88;
}

Assistant:

double find_double(var * element, const string & name, const string & desired_units, string default_units = "",
        double default_value = 0.0) {
    var * current = find(name, element);
    string units = current->units == "#" ? default_units : current->units;

    if (current->value == 0) {
        return default_value;
    } else {
        return convert_units(current->value, units, desired_units);
    }
}